

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

Time __thiscall
helics::TimeCoordinator::updateTimeBlocks(TimeCoordinator *this,int32_t blockId,Time newTime)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  int32_t blockId_local;
  Time newTime_local;
  
  ppVar2 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = 8;
  lVar6 = 0;
  for (lVar4 = (long)ppVar3 - (long)ppVar2 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (*(int *)((long)&(ppVar2->first).internalTimeCode + lVar7) == blockId) {
      ppVar5 = (pointer)((long)ppVar2 - lVar6);
      goto LAB_002d4c58;
    }
    if (*(int *)((long)&ppVar2[1].first.internalTimeCode + lVar7) == blockId) {
      ppVar5 = (pointer)((long)ppVar2 + (0x10 - lVar6));
      goto LAB_002d4c58;
    }
    if (*(int *)((long)&ppVar2[2].first.internalTimeCode + lVar7) == blockId) {
      ppVar5 = (pointer)((long)ppVar2 + (0x20 - lVar6));
      goto LAB_002d4c58;
    }
    if (*(int *)((long)&ppVar2[3].first.internalTimeCode + lVar7) == blockId) {
      ppVar5 = (pointer)((long)ppVar2 + (0x30 - lVar6));
      goto LAB_002d4c58;
    }
    lVar6 = lVar6 + -0x40;
    lVar7 = lVar7 + 0x40;
  }
  lVar4 = ((long)ppVar3 - (long)ppVar2) + lVar6 >> 4;
  ppVar5 = (pointer)((long)ppVar2 - lVar6);
  if (lVar4 == 1) {
LAB_002d4c50:
    if (ppVar5->second != blockId) {
      ppVar5 = ppVar3;
    }
LAB_002d4c58:
    if (ppVar5 != ppVar3) {
      (ppVar5->first).internalTimeCode = newTime.internalTimeCode;
      goto LAB_002d4c7f;
    }
  }
  else {
    if (lVar4 == 3) {
      if (*(int *)((long)&(ppVar2->first).internalTimeCode + lVar7) != blockId) {
        ppVar5 = (pointer)((long)ppVar2 + (0x10 - lVar6));
        goto LAB_002d4c46;
      }
      goto LAB_002d4c58;
    }
    if (lVar4 == 2) {
LAB_002d4c46:
      if (ppVar5->second != blockId) {
        ppVar5 = ppVar5 + 1;
        goto LAB_002d4c50;
      }
      goto LAB_002d4c58;
    }
  }
  blockId_local = blockId;
  newTime_local = newTime;
  std::
  vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
  ::emplace_back<TimeRepresentation<count_time<9,long>>&,int&>
            ((vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
              *)&this->timeBlocks,&newTime_local,&blockId_local);
  ppVar2 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_002d4c7f:
  ppVar1 = ppVar2;
  ppVar5 = ppVar2;
  if (ppVar2 != ppVar3) {
    while (ppVar2 = ppVar1, ppVar5 = ppVar5 + 1, ppVar5 != ppVar3) {
      ppVar1 = ppVar5;
      if ((ppVar2->first).internalTimeCode <= (ppVar5->first).internalTimeCode) {
        ppVar1 = ppVar2;
      }
    }
  }
  return (Time)(ppVar2->first).internalTimeCode;
}

Assistant:

Time TimeCoordinator::updateTimeBlocks(int32_t blockId, Time newTime)
{
    auto blk = std::find_if(timeBlocks.begin(), timeBlocks.end(), [blockId](const auto& block) {
        return (block.second == blockId);
    });
    if (blk != timeBlocks.end()) {
        blk->first = newTime;
    } else {
        timeBlocks.emplace_back(newTime, blockId);
    }
    auto res = std::min_element(timeBlocks.begin(),
                                timeBlocks.end(),
                                [](const auto& blk1, const auto& blk2) {
                                    return (blk1.first < blk2.first);
                                });
    return res->first;
}